

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugInManager.cpp
# Opt level: O3

void __thiscall CppUnit::PlugInManager::removeXmlOutputterHooks(PlugInManager *this)

{
  _Elt_pointer pPVar1;
  _Elt_pointer pPVar2;
  _Map_pointer ppPVar3;
  
  pPVar2 = (this->m_plugIns).
           super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (pPVar2 != (this->m_plugIns).
                super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    pPVar1 = (this->m_plugIns).
             super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppPVar3 = (this->m_plugIns).
              super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*pPVar2->m_interface->_vptr_CppUnitTestPlugIn[4])();
      pPVar2 = pPVar2 + 1;
      if (pPVar2 == pPVar1) {
        pPVar2 = ppPVar3[1];
        ppPVar3 = ppPVar3 + 1;
        pPVar1 = pPVar2 + 10;
      }
    } while (pPVar2 != (this->m_plugIns).
                       super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  return;
}

Assistant:

void 
PlugInManager::removeXmlOutputterHooks()
{
  for ( PlugIns::iterator it = m_plugIns.begin(); it != m_plugIns.end(); ++it )
    (*it).m_interface->removeXmlOutputterHooks();
}